

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O0

CoeffReturnType __thiscall
Eigen::internal::
product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<float,_1,_1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1>,_4,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
::coeff(product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<float,_1,_1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1>,_4,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
        *this,Index index)

{
  Scalar SVar1;
  ConstColXpr local_260;
  ConstRowXpr local_230;
  ConstTransposeReturnType local_198;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>,_1,_1,_false>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<float,_1,_1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1,_1,_false>_>
  local_100;
  undefined8 local_28;
  Index col;
  Index row;
  Index index_local;
  product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<float,_1,_1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1>,_4,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
  *this_local;
  
  local_28 = 0;
  col = index;
  row = index;
  index_local = (Index)this;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>_>_>
  ::row(&local_230,
        (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>_>
         *)this,index);
  DenseBase<Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>_>,_1,_1,_false>_>
  ::transpose(&local_198,
              (DenseBase<Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>,_1,_1,_false>_>
               *)&local_230);
  DenseBase<Eigen::Map<Eigen::Matrix<float,_1,_1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>_>::col
            (&local_260,
             (DenseBase<Eigen::Map<Eigen::Matrix<float,_1,_1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>_> *
             )&this->m_rhs,0);
  MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,-1,1,0,-1,1>const>const,Eigen::Block<Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>,-1,1,true>,-1,1,false>const>const,1,1,false>const>>
  ::
  cwiseProduct<Eigen::Block<Eigen::Map<Eigen::Matrix<float,1,1,1,1,1>,0,Eigen::Stride<0,0>>const,1,1,false>>
            (&local_100,&local_198,
             (MatrixBase<Eigen::Block<const_Eigen::Map<Eigen::Matrix<float,_1,_1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1,_1,_false>_>
              *)&local_260);
  SVar1 = DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>_>,_1,_1,_false>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<float,_1,_1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1,_1,_false>_>_>
          ::sum((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>,_1,_1,_false>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<float,_1,_1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1,_1,_false>_>_>
                 *)&local_100);
  return SVar1;
}

Assistant:

const CoeffReturnType coeff(Index index) const
  {
    const Index row = (RowsAtCompileTime == 1 || MaxRowsAtCompileTime==1) ? 0 : index;
    const Index col = (RowsAtCompileTime == 1 || MaxRowsAtCompileTime==1) ? index : 0;
    return (m_lhs.row(row).transpose().cwiseProduct( m_rhs.col(col) )).sum();
  }